

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.cc
# Opt level: O1

Enum * __thiscall
google::protobuf::util::converter::anon_unknown_0::TypeInfoForTypeResolver::GetEnumByTypeUrl
          (TypeInfoForTypeResolver *this,StringPiece type_url)

{
  string *psVar1;
  iterator iVar2;
  _Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  Enum *pEVar4;
  mapped_type *this_00;
  undefined8 uVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  StringPiece error_message;
  StringPiece error_message_00;
  undefined1 local_c0 [8];
  Status status;
  StringPiece type_url_local;
  char *local_80;
  char local_70 [16];
  undefined1 local_60 [8];
  StatusOrEnum result;
  unique_ptr<google::protobuf::Enum,_std::default_delete<google::protobuf::Enum>_> enum_type;
  
  type_url_local.ptr_ = (char *)type_url.length_;
  status.error_message_.field_2._8_8_ = type_url.ptr_;
  iVar2 = std::
          _Rb_tree<google::protobuf::StringPiece,_std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>,_std::_Select1st<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>_>
          ::find(&(this->cached_enums_)._M_t,(key_type *)((long)&status.error_message_.field_2 + 8))
  ;
  if ((_Rb_tree_header *)iVar2._M_node != &(this->cached_enums_)._M_t._M_impl.super__Rb_tree_header)
  {
    if (*(int *)&iVar2._M_node[1]._M_left != 0) {
      return (Enum *)0x0;
    }
    return (Enum *)iVar2._M_node[2]._M_right;
  }
  psVar1 = &result.status_.error_message_;
  local_60 = (undefined1  [8])psVar1;
  if (status.error_message_.field_2._8_8_ == 0) {
    result.status_.error_code_ = OK;
    result.status_._4_4_ = 0;
    result.status_.error_message_._M_dataplus._M_p._0_1_ = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,status.error_message_.field_2._8_8_,
               type_url_local.ptr_ + status.error_message_.field_2._8_8_);
  }
  pVar6 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->string_storage_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  _Var3 = pVar6.first._M_node;
  if (local_60 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_60);
  }
  pEVar4 = (Enum *)operator_new(0x58);
  Enum::Enum(pEVar4,(Arena *)0x0);
  result.value_ = pEVar4;
  (*this->type_resolver_->_vptr_TypeResolver[3])
            (local_c0,this->type_resolver_,_Var3._M_node + 1,pEVar4);
  pEVar4 = result.value_;
  if (local_c0._0_4_ == OK) {
    result.value_ = (Enum *)0x0;
    Status::Status((Status *)local_60);
    if (pEVar4 != (Enum *)0x0) {
      Status::operator=((Status *)local_60,(Status *)Status::OK);
      result.status_.error_message_.field_2._8_8_ = pEVar4;
      goto LAB_0032aeff;
    }
    error_message_00.length_ = 0x20;
    error_message_00.ptr_ = "nullptr is not a valid argument.";
    Status::Status((Status *)&type_url_local.length_,INTERNAL,error_message_00);
    Status::operator=((Status *)local_60,(Status *)&type_url_local.length_);
  }
  else {
    Status::Status((Status *)local_60);
    if (local_c0._0_4_ != OK) {
      Status::operator=((Status *)local_60,(Status *)local_c0);
      goto LAB_0032aeff;
    }
    error_message.length_ = 0x23;
    error_message.ptr_ = "Status::OK is not a valid argument.";
    Status::Status((Status *)&type_url_local.length_,INTERNAL,error_message);
    Status::operator=((Status *)local_60,(Status *)&type_url_local.length_);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
LAB_0032aeff:
  type_url_local.length_ = *(stringpiece_ssize_type *)(_Var3._M_node + 1);
  if ((long)_Var3._M_node[1]._M_parent < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)_Var3._M_node[1]._M_parent,"size_t to int conversion");
  }
  this_00 = std::
            map<google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>_>
            ::operator[](&this->cached_enums_,(key_type *)&type_url_local.length_);
  Status::operator=(&this_00->status_,(Status *)local_60);
  this_00->value_ = (Enum *)result.status_.error_message_.field_2._8_8_;
  uVar5 = result.status_.error_message_.field_2._8_8_;
  if (local_60._0_4_ != OK) {
    uVar5 = (Enum *)0x0;
  }
  if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
    operator_delete((void *)result.status_._0_8_);
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  pEVar4 = result.value_;
  if (result.value_ != (Enum *)0x0) {
    Enum::~Enum(result.value_);
    operator_delete(pEVar4);
  }
  return (Enum *)uVar5;
}

Assistant:

const google::protobuf::Enum* GetEnumByTypeUrl(
      StringPiece type_url) const override {
    std::map<StringPiece, StatusOrEnum>::iterator it =
        cached_enums_.find(type_url);
    if (it != cached_enums_.end()) {
      return it->second.ok() ? it->second.value() : NULL;
    }
    // Stores the string value so it can be referenced using StringPiece in the
    // cached_enums_ map.
    const std::string& string_type_url =
        *string_storage_.insert(std::string(type_url)).first;
    std::unique_ptr<google::protobuf::Enum> enum_type(
        new google::protobuf::Enum());
    util::Status status =
        type_resolver_->ResolveEnumType(string_type_url, enum_type.get());
    StatusOrEnum result =
        status.ok() ? StatusOrEnum(enum_type.release()) : StatusOrEnum(status);
    cached_enums_[string_type_url] = result;
    return result.ok() ? result.value() : NULL;
  }